

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O2

void __thiscall trackerboy::Module::Module(Module *this)

{
  InfoStr *pIVar1;
  
  SongList::SongList(&this->mSongs);
  Table<trackerboy::Instrument>::Table(&this->mInstrumentTable);
  Table<trackerboy::Waveform>::Table(&this->mWaveformTable);
  (this->mVersion).major = 0;
  (this->mVersion).minor = 0;
  *(undefined8 *)&(this->mVersion).patch = 0x100000000;
  this->mRevisionMinor = 1;
  (this->mTitle).super_array<char,_32UL>._M_elems[0] = '\0';
  (this->mTitle).super_array<char,_32UL>._M_elems[1] = '\0';
  (this->mTitle).super_array<char,_32UL>._M_elems[2] = '\0';
  (this->mTitle).super_array<char,_32UL>._M_elems[3] = '\0';
  (this->mTitle).super_array<char,_32UL>._M_elems[4] = '\0';
  (this->mTitle).super_array<char,_32UL>._M_elems[5] = '\0';
  (this->mTitle).super_array<char,_32UL>._M_elems[6] = '\0';
  (this->mTitle).super_array<char,_32UL>._M_elems[7] = '\0';
  pIVar1 = &this->mTitle;
  (pIVar1->super_array<char,_32UL>)._M_elems[8] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[9] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[10] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xb] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xc] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xd] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xe] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xf] = '\0';
  pIVar1 = &this->mTitle;
  (pIVar1->super_array<char,_32UL>)._M_elems[0x10] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x11] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x12] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x13] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x14] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x15] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x16] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x17] = '\0';
  pIVar1 = &this->mTitle;
  (pIVar1->super_array<char,_32UL>)._M_elems[0x18] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x19] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1a] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1b] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1c] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1d] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1e] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1f] = '\0';
  (this->mArtist).super_array<char,_32UL>._M_elems[0] = '\0';
  (this->mArtist).super_array<char,_32UL>._M_elems[1] = '\0';
  (this->mArtist).super_array<char,_32UL>._M_elems[2] = '\0';
  (this->mArtist).super_array<char,_32UL>._M_elems[3] = '\0';
  (this->mArtist).super_array<char,_32UL>._M_elems[4] = '\0';
  (this->mArtist).super_array<char,_32UL>._M_elems[5] = '\0';
  (this->mArtist).super_array<char,_32UL>._M_elems[6] = '\0';
  (this->mArtist).super_array<char,_32UL>._M_elems[7] = '\0';
  pIVar1 = &this->mArtist;
  (pIVar1->super_array<char,_32UL>)._M_elems[8] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[9] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[10] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xb] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xc] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xd] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xe] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xf] = '\0';
  pIVar1 = &this->mArtist;
  (pIVar1->super_array<char,_32UL>)._M_elems[0x10] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x11] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x12] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x13] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x14] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x15] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x16] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x17] = '\0';
  pIVar1 = &this->mArtist;
  (pIVar1->super_array<char,_32UL>)._M_elems[0x18] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x19] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1a] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1b] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1c] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1d] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1e] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1f] = '\0';
  (this->mCopyright).super_array<char,_32UL>._M_elems[0] = '\0';
  (this->mCopyright).super_array<char,_32UL>._M_elems[1] = '\0';
  (this->mCopyright).super_array<char,_32UL>._M_elems[2] = '\0';
  (this->mCopyright).super_array<char,_32UL>._M_elems[3] = '\0';
  (this->mCopyright).super_array<char,_32UL>._M_elems[4] = '\0';
  (this->mCopyright).super_array<char,_32UL>._M_elems[5] = '\0';
  (this->mCopyright).super_array<char,_32UL>._M_elems[6] = '\0';
  (this->mCopyright).super_array<char,_32UL>._M_elems[7] = '\0';
  pIVar1 = &this->mCopyright;
  (pIVar1->super_array<char,_32UL>)._M_elems[8] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[9] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[10] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xb] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xc] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xd] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xe] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0xf] = '\0';
  pIVar1 = &this->mCopyright;
  (pIVar1->super_array<char,_32UL>)._M_elems[0x10] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x11] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x12] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x13] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x14] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x15] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x16] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x17] = '\0';
  pIVar1 = &this->mCopyright;
  (pIVar1->super_array<char,_32UL>)._M_elems[0x18] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x19] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1a] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1b] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1c] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1d] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1e] = '\0';
  (pIVar1->super_array<char,_32UL>)._M_elems[0x1f] = '\0';
  (this->mComments)._M_dataplus._M_p = (pointer)&(this->mComments).field_2;
  (this->mComments)._M_string_length = 0;
  (this->mComments).field_2._M_local_buf[0] = '\0';
  this->mSystem = dmg;
  this->mCustomFramerate = 0x1e;
  return;
}

Assistant:

Module::Module() noexcept :
    mSongs(),
    mInstrumentTable(),
    mWaveformTable(),
    mVersion{0, 0, 0},
    mRevisionMajor(FILE_REVISION_MAJOR),
    mRevisionMinor(FILE_REVISION_MINOR),
    mTitle(),
    mArtist(),
    mCopyright(),
    mComments(),
    mSystem(System::dmg),
    mCustomFramerate(30)
{
}